

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

s32 __thiscall
irr::core::array<irr::scene::CMeshCache::MeshEntry>::binary_search
          (array<irr::scene::CMeshCache::MeshEntry> *this,MeshEntry *element,s32 left,s32 right)

{
  path *__lhs;
  pointer pMVar1;
  bool bVar2;
  __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
  _Var3;
  s32 sVar4;
  path *__rhs;
  
  sVar4 = -1;
  if (left <= right) {
    pMVar1 = (this->m_data).
             super__Vector_base<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var3 = ::std::
            __lower_bound<__gnu_cxx::__normal_iterator<irr::scene::CMeshCache::MeshEntry_const*,std::vector<irr::scene::CMeshCache::MeshEntry,std::allocator<irr::scene::CMeshCache::MeshEntry>>>,irr::scene::CMeshCache::MeshEntry,__gnu_cxx::__ops::_Iter_less_val>
                      (pMVar1 + left,pMVar1 + right,element);
    __lhs = &((_Var3._M_current)->NamedPath).InternalName;
    __rhs = &(element->NamedPath).InternalName;
    bVar2 = ::std::operator<(&__lhs->str,&__rhs->str);
    if (!bVar2) {
      bVar2 = ::std::operator<(&__rhs->str,&__lhs->str);
      if (!bVar2) {
        sVar4 = (s32)(((long)_Var3._M_current -
                      (long)(this->m_data).
                            super__Vector_base<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x48);
      }
    }
  }
  return sVar4;
}

Assistant:

s32 binary_search(const T &element, s32 left, s32 right) const
	{
		if (left > right)
			return -1;
		auto lpos = std::next(m_data.begin(), left);
		auto rpos = std::next(m_data.begin(), right);
		auto it = std::lower_bound(lpos, rpos, element);
		// *it = first element in [first, last) that is >= element, or last if not found.
		if (*it < element || element < *it)
			return -1;
		return static_cast<u32>(it - m_data.begin());
	}